

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata_cache.c
# Opt level: O2

void duckdb_je_edata_cache_put(tsdn_t *tsdn,edata_cache_t *edata_cache,edata_t *edata)

{
  malloc_mutex_lock(tsdn,&edata_cache->mtx);
  duckdb_je_edata_avail_insert(&edata_cache->avail,edata);
  (edata_cache->count).repr = (edata_cache->count).repr + 1;
  (edata_cache->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(edata_cache->mtx).field_0 + 0x48));
  return;
}

Assistant:

void
edata_cache_put(tsdn_t *tsdn, edata_cache_t *edata_cache, edata_t *edata) {
	malloc_mutex_lock(tsdn, &edata_cache->mtx);
	edata_avail_insert(&edata_cache->avail, edata);
	atomic_load_add_store_zu(&edata_cache->count, 1);
	malloc_mutex_unlock(tsdn, &edata_cache->mtx);
}